

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMapTest.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* HashMapInit_abi_cxx11_(bool verbose)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  undefined8 uVar4;
  ostream *poVar5;
  istream *piVar6;
  byte in_SIL;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  int len;
  ifstream wordfile;
  int sum;
  int lines;
  string filename;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *words;
  string *__x;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd47;
  istream local_278 [524];
  int local_6c;
  uint local_68;
  allocator local_51;
  string local_50 [32];
  string local_30 [38];
  byte local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_a = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1b3ab5);
  std::__cxx11::string::string(local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"/usr/share/dict/words",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  local_68 = 0;
  local_6c = 0;
  uVar4 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_278,uVar4,8);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Unable to open words dict file ");
    poVar5 = std::operator<<(poVar5,local_50);
    std::operator<<(poVar5,"\n");
  }
  else {
    while( true ) {
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_278,local_30);
      in_stack_fffffffffffffd47 =
           std::ios::operator_cast_to_bool((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
      if (!(bool)in_stack_fffffffffffffd47) break;
      __x = local_30;
      iVar3 = std::__cxx11::string::length();
      local_68 = local_68 + 1;
      local_6c = local_6c + iVar3;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40),(value_type *)__x
                 );
    }
    std::ifstream::close();
    uVar1 = local_68;
    if ((local_9 & 1) != 0) {
      uVar4 = std::__cxx11::string::c_str();
      printf("Read %d words from \'%s\'\n",(ulong)uVar1,uVar4);
      printf("Avg len: %0.3f\n",((double)local_6c + 0.0) / (double)(int)local_68);
    }
  }
  local_a = 1;
  std::ifstream::~ifstream(local_278);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  if ((local_a & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffd47,in_stack_fffffffffffffd40));
  }
  return in_RDI;
}

Assistant:

std::vector<std::string> HashMapInit(bool verbose) {
  std::vector<std::string> words;
  std::string line;
  std::string filename = "/usr/share/dict/words";
  int lines = 0, sum = 0;
  std::ifstream wordfile(filename.c_str());
  if (!wordfile.is_open()) {
    std::cout << "Unable to open words dict file " << filename << "\n";
    return words;
  }
  while (getline(wordfile, line)) {
    int len = line.length();
    lines++;
    sum += len;
    words.push_back(line);
  }
  wordfile.close();
  if (verbose) {
    printf ("Read %d words from '%s'\n", lines, filename.c_str());
    printf ("Avg len: %0.3f\n", (sum+0.0)/lines);
  }
  return words;
}